

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotation_test_util.cc
# Opt level: O0

bool google::protobuf::compiler::annotation_test_util::RunProtoCompiler
               (string *filename,string *plugin_specific_args,CommandLineInterface *cli,
               FileDescriptorProto *file)

{
  int iVar1;
  AlphaNum *b;
  char *local_208;
  char *argv [5];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  AlphaNum local_1b8;
  AlphaNum local_188;
  undefined1 local_158 [8];
  string capture_out;
  AlphaNum local_118;
  AlphaNum local_e8;
  undefined1 local_b8 [8];
  string proto_path;
  AlphaNum local_90;
  allocator<char> local_59;
  string local_58;
  undefined1 local_38 [8];
  DescriptorCapturingGenerator capturing_generator;
  FileDescriptorProto *file_local;
  CommandLineInterface *cli_local;
  string *plugin_specific_args_local;
  string *filename_local;
  
  capturing_generator.file_ = file;
  CommandLineInterface::SetInputsAreProtoPathRelative(cli,true);
  anon_unknown_2::DescriptorCapturingGenerator::DescriptorCapturingGenerator
            ((DescriptorCapturingGenerator *)local_38,capturing_generator.file_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"--capture_out",&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,anon_var_dwarf_37cdd0 + 5,
             (allocator<char> *)(proto_path.field_2._M_local_buf + 0xf));
  b = &local_90;
  CommandLineInterface::RegisterGenerator(cli,&local_58,(CodeGenerator *)local_38,(string *)b);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)(proto_path.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_e8,"-I");
  TestTempDir_abi_cxx11_();
  absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
            (&local_118,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&capture_out.field_2 + 8));
  absl::lts_20250127::StrCat_abi_cxx11_((string *)local_b8,(lts_20250127 *)&local_e8,&local_118,b);
  std::__cxx11::string::~string((string *)(capture_out.field_2._M_local_buf + 8));
  absl::lts_20250127::AlphaNum::AlphaNum(&local_188,"--capture_out=");
  TestTempDir_abi_cxx11_();
  absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_1b8,&local_1d8);
  absl::lts_20250127::StrCat_abi_cxx11_((string *)local_158,(lts_20250127 *)&local_188,&local_1b8,b)
  ;
  std::__cxx11::string::~string((string *)&local_1d8);
  local_208 = "protoc";
  argv[0] = (char *)std::__cxx11::string::c_str();
  argv[1] = (char *)std::__cxx11::string::c_str();
  argv[2] = (char *)std::__cxx11::string::c_str();
  argv[3] = (char *)std::__cxx11::string::c_str();
  iVar1 = CommandLineInterface::Run(cli,5,&local_208);
  std::__cxx11::string::~string((string *)local_158);
  std::__cxx11::string::~string((string *)local_b8);
  anon_unknown_2::DescriptorCapturingGenerator::~DescriptorCapturingGenerator
            ((DescriptorCapturingGenerator *)local_38);
  return iVar1 == 0;
}

Assistant:

bool RunProtoCompiler(const std::string& filename,
                      const std::string& plugin_specific_args,
                      CommandLineInterface* cli, FileDescriptorProto* file) {
  cli->SetInputsAreProtoPathRelative(true);

  DescriptorCapturingGenerator capturing_generator(file);
  cli->RegisterGenerator("--capture_out", &capturing_generator, "");

  std::string proto_path = absl::StrCat("-I", TestTempDir());
  std::string capture_out = absl::StrCat("--capture_out=", TestTempDir());

  const char* argv[] = {"protoc", proto_path.c_str(),
                        plugin_specific_args.c_str(), capture_out.c_str(),
                        filename.c_str()};

  return cli->Run(5, argv) == 0;
}